

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

void __thiscall soplex::SSVectorBase<double>::setValue(SSVectorBase<double> *this,int i,double x)

{
  int iVar1;
  int *piVar2;
  Tolerances *this_00;
  uint uVar3;
  double dVar4;
  ulong in_XMM0_Qb;
  double dVar5;
  int local_2c;
  double local_28;
  ulong uStack_20;
  double local_18;
  ulong uStack_10;
  
  local_2c = i;
  if (this->setupStatus == true) {
    local_28 = x;
    uStack_20 = in_XMM0_Qb;
    uVar3 = IdxSet::pos(&this->super_IdxSet,i);
    if ((int)uVar3 < 0) {
      dVar5 = ABS(local_28);
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 == (Tolerances *)0x0) {
        dVar4 = 0.0;
      }
      else {
        local_18 = dVar5;
        uStack_10 = uStack_20 & 0x7fffffffffffffff;
        dVar4 = Tolerances::epsilon(this_00);
        dVar5 = local_18;
      }
      x = local_28;
      if (dVar4 < dVar5) {
        IdxSet::add(&this->super_IdxSet,1,&local_2c);
        x = local_28;
      }
    }
    else {
      x = local_28;
      if ((local_28 == 0.0) && (!NAN(local_28))) {
        piVar2 = (this->super_IdxSet).idx;
        (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[piVar2[uVar3]] = 0.0;
        iVar1 = (this->super_IdxSet).num;
        (this->super_IdxSet).num = iVar1 + -1;
        piVar2[uVar3] = piVar2[(long)iVar1 + -1];
      }
    }
  }
  (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[local_2c] = x;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }